

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall MakefileGenerator::writeExtraTargets(MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  ProStringList *pPVar5;
  ProString *pPVar6;
  ProStringList *pPVar7;
  QList<ProString> *vector;
  qsizetype qVar8;
  QTextStream *pQVar9;
  ProString *this_00;
  ProString *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_EXTRA_TARGETS");
  pPVar5 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  pPVar6 = (pPVar5->super_QList<ProString>).d.ptr;
  for (this_00 = pPVar6; this_00 != pPVar6 + (pPVar5->super_QList<ProString>).d.size;
      this_00 = this_00 + 1) {
    local_88.size = -0x5555555555555556;
    local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_88.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_a8.ptr = L".target";
    local_a8.d = (Data *)this_00;
    ProString::ProString<ProString_const&,char_const(&)[8]>
              (&local_68,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_a8);
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])(&local_88,this,&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    local_a8.size = -0x5555555555555556;
    local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_c8.ptr = L".commands";
    local_c8.d = (Data *)this_00;
    ProString::ProString<ProString_const&,char_const(&)[10]>
              (&local_68,(QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)&local_c8);
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])(&local_a8,this,&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    local_c8.size = 0;
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (char16_t *)0x0;
    if ((char16_t *)local_88.size == (char16_t *)0x0) {
      ProString::toQString(&local_68.m_string,this_00);
      qVar8 = local_88.size;
      pcVar4 = local_88.ptr;
      pDVar3 = local_88.d;
      local_88.d = local_68.m_string.d.d;
      local_88.ptr = local_68.m_string.d.ptr;
      local_68.m_string.d.d = pDVar3;
      local_68.m_string.d.ptr = pcVar4;
      local_88.size = local_68.m_string.d.size;
      local_68.m_string.d.size = qVar8;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    }
    pQVar1 = this->project;
    local_e8.ptr = L".depends";
    local_e8.d = (Data *)this_00;
    ProString::ProString<ProString_const&,char_const(&)[9]>
              (&local_68,(QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)&local_e8);
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    pPVar6 = (pPVar7->super_QList<ProString>).d.ptr;
    for (this_01 = pPVar6; this_01 != pPVar6 + (pPVar7->super_QList<ProString>).d.size;
        this_01 = this_01 + 1) {
      local_e8.size = -0x5555555555555556;
      local_e8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_e8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_108.ptr = L".target";
      local_108.d = (Data *)this_01;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                (&local_68,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_108);
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])(&local_e8,this,&local_68)
      ;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      if ((char16_t *)local_e8.size == (char16_t *)0x0) {
        ProString::toQString(&local_68.m_string,this_01);
        qVar8 = local_e8.size;
        pcVar4 = local_e8.ptr;
        pDVar3 = local_e8.d;
        local_e8.d = local_68.m_string.d.d;
        local_e8.ptr = local_68.m_string.d.ptr;
        local_68.m_string.d.d = pDVar3;
        local_68.m_string.d.ptr = pcVar4;
        local_e8.size = local_68.m_string.d.size;
        local_68.m_string.d.size = qVar8;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      }
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(&local_108,this,&local_e8)
      ;
      qVar8 = local_108.size;
      local_68.m_string.d.size = (qsizetype)local_108.ptr;
      local_68.m_string.d.ptr = (char16_t *)local_108.d;
      local_68.m_string.d.d = (Data *)0x21fe9e;
      local_108.d = (Data *)0x0;
      local_108.ptr = (char16_t *)0x0;
      local_108.size = 0;
      qVar2 = local_108.size;
      local_108.size._0_4_ = (undefined4)qVar8;
      local_108.size._4_4_ = SUB84(qVar8,4);
      local_68.m_offset = (undefined4)local_108.size;
      local_68.m_length = local_108.size._4_4_;
      local_108.size = qVar2;
      ::operator+=((QString *)&local_c8,(QStringBuilder<const_char_(&)[2],_QString> *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&local_68.m_string.d.ptr);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      pPVar6 = (pPVar7->super_QList<ProString>).d.ptr;
    }
    pQVar1 = this->project;
    local_e8.ptr = L".CONFIG";
    local_e8.d = (Data *)this_00;
    ProString::ProString<ProString_const&,char_const(&)[8]>
              (&local_68,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_e8);
    vector = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68)->
              super_QList<ProString>;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    qVar8 = QtPrivate::indexOf<ProString,char[11]>(vector,(char (*) [11])"fix_target",0);
    if (qVar8 != -1) {
      fileFixify(&local_68.m_string,this,(QString *)&local_88,(FileFixifyTypes)0x1,true);
      qVar8 = local_88.size;
      pcVar4 = local_88.ptr;
      pDVar3 = local_88.d;
      local_88.d = local_68.m_string.d.d;
      local_88.ptr = local_68.m_string.d.ptr;
      local_68.m_string.d.d = pDVar3;
      local_68.m_string.d.ptr = pcVar4;
      local_88.size = local_68.m_string.d.size;
      local_68.m_string.d.size = qVar8;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    }
    qVar8 = QtPrivate::indexOf<ProString,char[6]>(vector,(char (*) [6])"phony",0);
    if (qVar8 != -1) {
      QtPrivate::lengthHelperPointer<char>(" FORCE");
      QString::append((QLatin1String *)&local_c8);
    }
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(&local_68,this,&local_88);
    pQVar9 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_68);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,":");
    QTextStream::operator<<(pQVar9,(QString *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    if (local_a8.size != 0) {
      pQVar9 = (QTextStream *)QTextStream::operator<<(t,"\n\t");
      QTextStream::operator<<(pQVar9,(QString *)&local_a8);
    }
    pQVar9 = (QTextStream *)Qt::endl(t);
    Qt::endl(pQVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    pPVar6 = (pPVar5->super_QList<ProString>).d.ptr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writeExtraTargets(QTextStream &t)
{
    const ProStringList &qut = project->values("QMAKE_EXTRA_TARGETS");
    for (ProStringList::ConstIterator it = qut.begin(); it != qut.end(); ++it) {
        QString targ = var(ProKey(*it + ".target")),
                 cmd = var(ProKey(*it + ".commands")), deps;
        if(targ.isEmpty())
            targ = (*it).toQString();
        const ProStringList &deplist = project->values(ProKey(*it + ".depends"));
        for (ProStringList::ConstIterator dep_it = deplist.begin(); dep_it != deplist.end(); ++dep_it) {
            QString dep = var(ProKey(*dep_it + ".target"));
            if(dep.isEmpty())
                dep = (*dep_it).toQString();
            deps += " " + escapeDependencyPath(dep);
        }
        const ProStringList &config = project->values(ProKey(*it + ".CONFIG"));
        if (config.indexOf("fix_target") != -1)
            targ = fileFixify(targ, FileFixifyFromOutdir);
        if (config.indexOf("phony") != -1)
            deps += QLatin1String(" FORCE");
        t << escapeDependencyPath(targ) << ":" << deps;
        if(!cmd.isEmpty())
            t << "\n\t" << cmd;
        t << Qt::endl << Qt::endl;
    }
}